

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O0

base_learner * kernel_svm_setup(options_i *options,vw *all)

{
  byte bVar1;
  int iVar2;
  vw *pvVar3;
  option_group_definition *funcName;
  loss_function *plVar4;
  svm_model *psVar5;
  pointer psVar6;
  svm_example **ppsVar7;
  ostream *poVar8;
  void *pvVar9;
  double *pdVar10;
  learner<svm_params,_example> *this;
  vw *in_RSI;
  long *in_RDI;
  __type _Var11;
  learner<svm_params,_example> *l;
  float loss_parameter;
  string loss_function;
  option_group_definition new_options;
  bool ksvm;
  int degree;
  float bandwidth;
  string kernel_type;
  free_ptr<svm_params> params;
  undefined4 in_stack_ffffffffffffee18;
  uint32_t in_stack_ffffffffffffee1c;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffee20;
  string *in_stack_ffffffffffffee28;
  undefined4 in_stack_ffffffffffffee30;
  int in_stack_ffffffffffffee34;
  _func_void_svm_params_ptr *in_stack_ffffffffffffee38;
  learner<svm_params,_example> *in_stack_ffffffffffffee40;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffee68;
  option_group_definition *in_stack_ffffffffffffee70;
  byte local_1142;
  allocator *paVar12;
  float fVar13;
  allocator local_f69;
  string local_f68 [32];
  string local_f48 [32];
  undefined4 local_f28;
  allocator local_f21;
  string local_f20 [32];
  undefined4 local_f00;
  allocator local_ef9;
  string local_ef8 [39];
  allocator local_ed1;
  string local_ed0 [32];
  typed_option<int> local_eb0 [2];
  allocator local_d69;
  string local_d68 [39];
  allocator local_d41;
  string local_d40 [32];
  typed_option<float> local_d20 [2];
  allocator local_bd9;
  string local_bd8 [39];
  allocator local_bb1;
  string local_bb0 [39];
  allocator local_b89;
  string local_b88 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b68 [2];
  allocator local_a21;
  string local_a20 [39];
  allocator local_9f9;
  string local_9f8 [359];
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [359];
  allocator local_701;
  string local_700 [39];
  allocator local_6d9;
  string local_6d8 [359];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [359];
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [359];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  typed_option<bool> local_208 [2];
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [63];
  byte local_51;
  int local_50;
  float local_4c;
  string local_48 [48];
  vw *local_18;
  long *local_10;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<svm_params>();
  std::__cxx11::string::string(local_48);
  local_4c = 1.0;
  local_50 = 2;
  local_51 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Kernel SVM",&local_b1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffee20,
             (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"ksvm",&local_229);
  VW::config::make_option<bool>(in_stack_ffffffffffffee28,(bool *)in_stack_ffffffffffffee20);
  VW::config::typed_option<bool>::keep(local_208,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"kernel svm",&local_251);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffee20,
             (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffee20,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffee70,(typed_option<bool> *)in_stack_ffffffffffffee68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"reprocess",&local_3b9);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x304129);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffee28,(unsigned_long *)in_stack_ffffffffffffee20);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30),
             (unsigned_long)in_stack_ffffffffffffee28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e0,"number of reprocess steps for LASVM",&local_3e1);
  pvVar3 = (vw *)VW::config::typed_option<unsigned_long>::help
                           ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20,
                            (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18))
  ;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  funcName = VW::config::option_group_definition::add<unsigned_long>
                       (in_stack_ffffffffffffee70,
                        (typed_option<unsigned_long> *)in_stack_ffffffffffffee68);
  paVar12 = &local_549;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"pool_greedy",paVar12);
  fVar13 = (float)((ulong)paVar12 >> 0x20);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x30422b);
  VW::config::make_option<bool>(in_stack_ffffffffffffee28,(bool *)in_stack_ffffffffffffee20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"use greedy selection on mini pools",&local_571);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffee20,
             (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffee20,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffee70,(typed_option<bool> *)in_stack_ffffffffffffee68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"para_active",&local_6d9);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x304311);
  VW::config::make_option<bool>(in_stack_ffffffffffffee28,(bool *)in_stack_ffffffffffffee20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"do parallel active learning",&local_701);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffee20,
             (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)in_stack_ffffffffffffee20,
             (typed_option<bool> *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::option_group_definition::add<bool>
            (in_stack_ffffffffffffee70,(typed_option<bool> *)in_stack_ffffffffffffee68);
  paVar12 = &local_869;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_868,"pool_size",paVar12);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x3043f7);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffee28,(unsigned_long *)in_stack_ffffffffffffee20);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30),
             (unsigned_long)in_stack_ffffffffffffee28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"size of pools for active learning",&local_891);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20,
             (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffee70,(typed_option<unsigned_long> *)in_stack_ffffffffffffee68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f8,"subsample",&local_9f9);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x3044f9);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffee28,(unsigned_long *)in_stack_ffffffffffffee20);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30),
             (unsigned_long)in_stack_ffffffffffffee28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a20,"number of items to subsample from the pool",&local_a21);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20,
             (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20,
             (typed_option<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_ffffffffffffee70,(typed_option<unsigned_long> *)in_stack_ffffffffffffee68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b88,"kernel",&local_b89);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffee28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee20);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_b68,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bb0,"linear",&local_bb1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  default_value((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30),
                in_stack_ffffffffffffee28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd8,"type of kernel (rbf or linear (default))",&local_bd9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffee20,
       (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(in_stack_ffffffffffffee20,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d40,"bandwidth",&local_d41);
  VW::config::make_option<float>(in_stack_ffffffffffffee28,(float *)in_stack_ffffffffffffee20);
  VW::config::typed_option<float>::keep(local_d20,true);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30),
             (float)((ulong)in_stack_ffffffffffffee28 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d68,"bandwidth of rbf kernel",&local_d69);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffee20,
             (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_ffffffffffffee20,
             (typed_option<float> *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::option_group_definition::add<float>
            (in_stack_ffffffffffffee70,(typed_option<float> *)in_stack_ffffffffffffee68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ed0,"degree",&local_ed1);
  VW::config::make_option<int>(in_stack_ffffffffffffee28,(int *)in_stack_ffffffffffffee20);
  VW::config::typed_option<int>::keep(local_eb0,true);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30),
             (int)((ulong)in_stack_ffffffffffffee28 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ef8,"degree of poly kernel",&local_ef9);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_ffffffffffffee20,
             (string *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)in_stack_ffffffffffffee20,
             (typed_option<int> *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
  VW::config::option_group_definition::add<int>
            (in_stack_ffffffffffffee70,(typed_option<int> *)in_stack_ffffffffffffee68);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_ef8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef9);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_ed0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ed1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_d40);
  std::allocator<char>::~allocator((allocator<char> *)&local_d41);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
  std::__cxx11::string::~string(local_bb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_b89);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_a20);
  std::allocator<char>::~allocator((allocator<char> *)&local_a21);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_9f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  (**(code **)*local_10)(local_10,local_90);
  if ((local_51 & 1) == 0) {
    local_8 = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
    local_f00 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f20,"hinge",&local_f21);
    std::allocator<char>::~allocator((allocator<char> *)&local_f21);
    local_f28 = 0;
    if (local_18->loss != (loss_function *)0x0) {
      (*local_18->loss->_vptr_loss_function[9])();
    }
    std::__cxx11::string::string(local_f48,local_f20);
    plVar4 = getLossFunction(pvVar3,&funcName->m_name,fVar13);
    local_18->loss = plVar4;
    std::__cxx11::string::~string(local_f48);
    psVar5 = calloc_or_throw<svm_model>();
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x3055bb);
    psVar6->model = psVar5;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x3055d4);
    psVar6->model->num_support = 0;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x3055ec);
    psVar6->maxcache = 0x40000000;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305601);
    pvVar3 = local_18;
    psVar6->loss_sum = 0.0;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305629);
    psVar6->all = pvVar3;
    if ((local_18->active & 1U) != 0) {
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305656);
      psVar6->active = true;
    }
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x3056ce);
    if ((psVar6->active & 1U) != 0) {
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x3056e1);
      psVar6->active_c = 1.0;
    }
    std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
              ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x3056fb);
    ppsVar7 = calloc_or_throw<svm_example*>((size_t)paVar12);
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305723);
    psVar6->pool = ppsVar7;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x30573c);
    psVar6->pool_pos = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f68,"subsample",&local_f69);
    bVar1 = (**(code **)(*local_10 + 8))(local_10,local_f68);
    local_1142 = 0;
    if ((bVar1 & 1) == 0) {
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x3057cd);
      local_1142 = psVar6->para_active;
    }
    std::__cxx11::string::~string(local_f68);
    std::allocator<char>::~allocator((allocator<char> *)&local_f69);
    if ((local_1142 & 1) != 0) {
      std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x30581c);
      _Var11 = std::ceil<unsigned_long>(0x30583d);
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x30588c);
      psVar6->subsample =
           (long)_Var11 | (long)(_Var11 - 9.223372036854776e+18) & (long)_Var11 >> 0x3f;
    }
    fVar13 = local_18->l2_lambda;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305909);
    psVar6->lambda = fVar13;
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305924);
    if ((psVar6->lambda == 0.0) && (!NAN(psVar6->lambda))) {
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305945);
      psVar6->lambda = 1.0;
    }
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x30595f);
    poVar8 = std::operator<<(&(psVar6->all->trace_message).super_ostream,"Lambda = ");
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305990);
    pvVar9 = (void *)std::ostream::operator<<(poVar8,psVar6->lambda);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                       ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x3059c9);
    poVar8 = std::operator<<(&(psVar6->all->trace_message).super_ostream,"Kernel = ");
    poVar8 = std::operator<<(poVar8,local_48);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    iVar2 = std::__cxx11::string::compare((char *)local_48);
    if (iVar2 == 0) {
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305a45);
      psVar6->kernel_type = 1;
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305a57);
      poVar8 = std::operator<<(&(psVar6->all->trace_message).super_ostream,"bandwidth = ");
      pvVar9 = (void *)std::ostream::operator<<(poVar8,local_4c);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      pdVar10 = calloc_or_throw<double>();
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305abe);
      fVar13 = local_4c;
      psVar6->kernel_params = pdVar10;
      psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                         ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305ae3);
      *(float *)psVar6->kernel_params = fVar13;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_48);
      if (iVar2 == 0) {
        psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                           ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305b25);
        psVar6->kernel_type = 2;
        psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                           ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305b37);
        poVar8 = std::operator<<(&(psVar6->all->trace_message).super_ostream,"degree = ");
        in_stack_ffffffffffffee40 =
             (learner<svm_params,_example> *)std::ostream::operator<<(poVar8,local_50);
        std::ostream::operator<<(in_stack_ffffffffffffee40,std::endl<char,std::char_traits<char>>);
        in_stack_ffffffffffffee38 = (_func_void_svm_params_ptr *)calloc_or_throw<int>();
        psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                           ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305b9c);
        psVar6->kernel_params = in_stack_ffffffffffffee38;
        in_stack_ffffffffffffee34 = local_50;
        psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                           ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305bbd);
        *(int *)psVar6->kernel_params = in_stack_ffffffffffffee34;
      }
      else {
        psVar6 = std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
                           ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305bd6);
        psVar6->kernel_type = 0;
      }
    }
    std::unique_ptr<svm_params,_void_(*)(void_*)>::operator->
              ((unique_ptr<svm_params,_void_(*)(void_*)> *)0x305bed);
    parameters::stride_shift((parameters *)in_stack_ffffffffffffee20,in_stack_ffffffffffffee1c);
    this = LEARNER::init_learner<svm_params,example,LEARNER::learner<char,example>>
                     ((free_ptr<svm_params> *)
                      CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30),
                      (_func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_ffffffffffffee28,
                      (_func_void_svm_params_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_ffffffffffffee20,
                      CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
    LEARNER::learner<svm_params,_example>::set_save_load(this,save_load);
    LEARNER::learner<svm_params,_example>::set_finish
              (in_stack_ffffffffffffee40,in_stack_ffffffffffffee38);
    in_stack_ffffffffffffee20 =
         (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)LEARNER::make_base<svm_params,example>(this);
    local_f00 = 1;
    local_8 = in_stack_ffffffffffffee20;
    std::__cxx11::string::~string(local_f20);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<svm_params,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<svm_params,_void_(*)(void_*)> *)
             CONCAT44(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30));
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* kernel_svm_setup(options_i& options, vw& all)
{
  auto params = scoped_calloc_or_throw<svm_params>();
  std::string kernel_type;
  float bandwidth = 1.f;
  int degree = 2;

  bool ksvm = false;

  option_group_definition new_options("Kernel SVM");
  new_options.add(make_option("ksvm", ksvm).keep().help("kernel svm"))
      .add(make_option("reprocess", params->reprocess).default_value(1).help("number of reprocess steps for LASVM"))
      .add(make_option("pool_greedy", params->active_pool_greedy).help("use greedy selection on mini pools"))
      .add(make_option("para_active", params->para_active).help("do parallel active learning"))
      .add(make_option("pool_size", params->pool_size).default_value(1).help("size of pools for active learning"))
      .add(make_option("subsample", params->subsample)
               .default_value(1)
               .help("number of items to subsample from the pool"))
      .add(make_option("kernel", kernel_type)
               .keep()
               .default_value("linear")
               .help("type of kernel (rbf or linear (default))"))
      .add(make_option("bandwidth", bandwidth).keep().default_value(1.f).help("bandwidth of rbf kernel"))
      .add(make_option("degree", degree).keep().default_value(2).help("degree of poly kernel"));
  options.add_and_parse(new_options);

  if (!ksvm)
  {
    return nullptr;
  }

  string loss_function = "hinge";
  float loss_parameter = 0.0;
  delete all.loss;
  all.loss = getLossFunction(all, loss_function, (float)loss_parameter);

  params->model = &calloc_or_throw<svm_model>();
  params->model->num_support = 0;
  params->maxcache = 1024 * 1024 * 1024;
  params->loss_sum = 0.;
  params->all = &all;

  // This param comes from the active reduction.
  // During options refactor: this changes the semantics a bit - now this will only be true if --active was supplied and
  // NOT --simulation
  if (all.active)
    params->active = true;
  if (params->active)
    params->active_c = 1.;

  params->pool = calloc_or_throw<svm_example*>(params->pool_size);
  params->pool_pos = 0;

  if (!options.was_supplied("subsample") && params->para_active)
    params->subsample = (size_t)ceil(params->pool_size / all.all_reduce->total);

  params->lambda = all.l2_lambda;
  if (params->lambda == 0.)
    params->lambda = 1.;
  params->all->trace_message << "Lambda = " << params->lambda << endl;
  params->all->trace_message << "Kernel = " << kernel_type << endl;

  if (kernel_type.compare("rbf") == 0)
  {
    params->kernel_type = SVM_KER_RBF;
    params->all->trace_message << "bandwidth = " << bandwidth << endl;
    params->kernel_params = &calloc_or_throw<double>();
    *((float*)params->kernel_params) = bandwidth;
  }
  else if (kernel_type.compare("poly") == 0)
  {
    params->kernel_type = SVM_KER_POLY;
    params->all->trace_message << "degree = " << degree << endl;
    params->kernel_params = &calloc_or_throw<int>();
    *((int*)params->kernel_params) = degree;
  }
  else
    params->kernel_type = SVM_KER_LIN;

  params->all->weights.stride_shift(0);

  learner<svm_params, example>& l = init_learner(params, learn, predict, 1);
  l.set_save_load(save_load);
  l.set_finish(finish);
  return make_base(l);
}